

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTrace.cpp
# Opt level: O2

char * __thiscall llbuild::core::BuildEngineTrace::getTaskName(BuildEngineTrace *this,Task *task)

{
  FILE *__stream;
  iterator iVar1;
  char *pcVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>,_bool>
  pVar3;
  Task *task_local;
  char name [64];
  
  __stream = (FILE *)this->outputPtr;
  task_local = task;
  iVar1 = std::
          _Hashtable<const_llbuild::core::Task_*,_std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llbuild::core::Task_*>,_std::hash<const_llbuild::core::Task_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->taskNames)._M_h,&task_local);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    this->numNamedTasks = this->numNamedTasks + 1;
    snprintf(name,0x40,"T%d");
    pVar3 = std::
            _Hashtable<llbuild::core::Task_const*,std::pair<llbuild::core::Task_const*const,std::__cxx11::string>,std::allocator<std::pair<llbuild::core::Task_const*const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<llbuild::core::Task_const*>,std::hash<llbuild::core::Task_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<llbuild::core::Task_const*&,char(&)[64]>
                      ((_Hashtable<llbuild::core::Task_const*,std::pair<llbuild::core::Task_const*const,std::__cxx11::string>,std::allocator<std::pair<llbuild::core::Task_const*const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<llbuild::core::Task_const*>,std::hash<llbuild::core::Task_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->taskNames,&task_local,name);
    fprintf(__stream,"{ \"new-task\", \"%s\" },\n",name);
    pcVar2 = *(char **)((long)pVar3.first.
                              super__Node_iterator_base<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                              ._M_cur.
                              super__Node_iterator_base<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                       + 0x10);
  }
  else {
    pcVar2 = *(char **)((long)iVar1.
                              super__Node_iterator_base<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                              ._M_cur + 0x10);
  }
  return pcVar2;
}

Assistant:

const char* BuildEngineTrace::getTaskName(const Task* task) {
  FILE *fp = static_cast<FILE*>(outputPtr);

  // See if we have already assigned a name.
  auto it = taskNames.find(task);
  if (it != taskNames.end())
    return it->second.c_str();

  // Otherwise, create a name.
  char name[64];
  snprintf(name, sizeof(name), "T%d", ++numNamedTasks);
  auto result = taskNames.emplace(task, name);

  // Report the newly seen rule.
  fprintf(fp, "{ \"new-task\", \"%s\" },\n", name);

  return result.first->second.c_str();
}